

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_57051::DiskInterfaceTestRemoveFile::Run(DiskInterfaceTestRemoveFile *this)

{
  Test *pTVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *kFileName;
  DiskInterfaceTestRemoveFile *this_local;
  
  pTVar1 = g_current_test;
  local_18 = "file-to-remove";
  kFileName = (char *)this;
  bVar3 = DiskInterfaceTest::Touch(&this->super_DiskInterfaceTest,"file-to-remove");
  bVar3 = testing::Test::Check
                    (pTVar1,bVar3,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                     ,0xd2,"Touch(kFileName)");
  pcVar2 = local_18;
  pTVar1 = g_current_test;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar2,&local_39);
    iVar4 = RealDiskInterface::RemoveFile(&(this->super_DiskInterfaceTest).disk_,&local_38);
    testing::Test::Check
              (pTVar1,iVar4 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
               ,0xd3,"0 == disk_.RemoveFile(kFileName)");
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    pcVar2 = local_18;
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar2,&local_71);
    iVar4 = RealDiskInterface::RemoveFile(&(this->super_DiskInterfaceTest).disk_,&local_70);
    testing::Test::Check
              (pTVar1,iVar4 == 1,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
               ,0xd4,"1 == disk_.RemoveFile(kFileName)");
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"does not exist",&local_99);
    iVar4 = RealDiskInterface::RemoveFile(&(this->super_DiskInterfaceTest).disk_,&local_98);
    testing::Test::Check
              (pTVar1,iVar4 == 1,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
               ,0xd5,"1 == disk_.RemoveFile(\"does not exist\")");
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(DiskInterfaceTest, RemoveFile) {
  const char* kFileName = "file-to-remove";
  ASSERT_TRUE(Touch(kFileName));
  EXPECT_EQ(0, disk_.RemoveFile(kFileName));
  EXPECT_EQ(1, disk_.RemoveFile(kFileName));
  EXPECT_EQ(1, disk_.RemoveFile("does not exist"));
#ifdef _WIN32
  ASSERT_TRUE(Touch(kFileName));
  EXPECT_EQ(0, system((std::string("attrib +R ") + kFileName).c_str()));
  EXPECT_EQ(0, disk_.RemoveFile(kFileName));
  EXPECT_EQ(1, disk_.RemoveFile(kFileName));
#endif
}